

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall ECDSAAdaptor_ExtractSecret_Test::TestBody(ECDSAAdaptor_ExtractSecret_Test *this)

{
  SigHashType *this_00;
  bool bVar1;
  char *message;
  AssertHelper local_c8;
  Message local_c0;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  Privkey sec;
  ByteData raw_sig;
  SigHashType sig_hash;
  ECDSAAdaptor_ExtractSecret_Test *this_local;
  
  this_00 = (SigHashType *)
            ((long)&raw_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  cfd::core::SigHashType::SigHashType(this_00);
  cfd::core::CryptoUtil::ConvertSignatureFromDer((ByteData *)&sec.is_compressed_,&sig_der,this_00);
  cfd::core::AdaptorUtil::ExtractSecret
            ((Privkey *)local_58,&adaptor_sig2,(ByteData *)&sec.is_compressed_,&adaptor);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_98,&secret);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_b8,(Privkey *)local_58);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_78,"secret.GetHex()","sec.GetHex()",&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x47,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  cfd::core::Privkey::~Privkey((Privkey *)local_58);
  cfd::core::ByteData::~ByteData((ByteData *)&sec.is_compressed_);
  return;
}

Assistant:

TEST(ECDSAAdaptor, ExtractSecret) {
  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);

  auto sec = AdaptorUtil::ExtractSecret(adaptor_sig2, raw_sig, adaptor);

  EXPECT_EQ(secret.GetHex(), sec.GetHex());
}